

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsPublicationSetMinimumChange(HelicsPublication pub,double tolerance,HelicsError *err)

{
  Publication *pPVar1;
  PublicationObject *pPVar2;
  
  pPVar2 = anon_unknown.dwarf_694c0::verifyPublication(pub,err);
  if (pPVar2 != (PublicationObject *)0x0) {
    pPVar1 = pPVar2->pubPtr;
    if (pPVar1->delta <= 0.0 && pPVar1->delta != 0.0) {
      pPVar1->changeDetectionEnabled = true;
    }
    pPVar1->delta = tolerance;
    if (tolerance < 0.0) {
      pPVar1->changeDetectionEnabled = false;
    }
  }
  return;
}

Assistant:

void helicsPublicationSetMinimumChange(HelicsPublication pub, double tolerance, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    pubObj->pubPtr->setMinimumChange(tolerance);
}